

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void QIconModeViewBase::addLeaf(QList<int> *leaf,QRect *area,uint visited,Data data)

{
  bool bVar1;
  uint uVar2;
  qsizetype qVar3;
  const_reference piVar4;
  QListViewItem *this;
  reference item;
  long in_RCX;
  uint in_EDX;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  int idx;
  int i;
  QIconModeViewBase *_this;
  QListViewItem *vi;
  QModelIndex index;
  parameter_type in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  int local_64;
  undefined4 in_stack_ffffffffffffffb0;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_64 = 0; qVar3 = QList<int>::size(in_RDI), local_64 < qVar3; local_64 = local_64 + 1) {
    piVar4 = QList<int>::at((QList<int> *)
                            CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                            (qsizetype)in_stack_ffffffffffffff78);
    if (-1 < *piVar4) {
      this = (QListViewItem *)(long)*piVar4;
      qVar3 = QList<QListViewItem>::size((QList<QListViewItem> *)(in_RCX + 0x60));
      if ((long)this < qVar3) {
        item = QList<QListViewItem>::operator[]
                         ((QList<QListViewItem> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          (qsizetype)in_stack_ffffffffffffff78);
        bVar1 = QListViewItem::isValid(this);
        in_stack_ffffffffffffff87 = false;
        if (bVar1) {
          local_18 = QListViewItem::rect(this);
          uVar2 = QRect::intersects((QRect *)&local_18);
          in_stack_ffffffffffffff87 = false;
          if ((uVar2 & 1) != 0) {
            in_stack_ffffffffffffff87 = item->visited != in_EDX;
          }
        }
        if ((bool)in_stack_ffffffffffffff87 != false) {
          QListViewPrivate::listViewItemToIndex
                    ((QListViewPrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),item);
          QList<QModelIndex>::append
                    ((QList<QModelIndex> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
          item->visited = in_EDX;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconModeViewBase::addLeaf(QList<int> &leaf, const QRect &area, uint visited,
                                QBspTree::Data data)
{
    QListViewItem *vi;
    QIconModeViewBase *_this = static_cast<QIconModeViewBase *>(data.ptr);
    for (int i = 0; i < leaf.size(); ++i) {
        int idx = leaf.at(i);
        if (idx < 0 || idx >= _this->items.size())
            continue;
        vi = &_this->items[idx];
        Q_ASSERT(vi);
        if (vi->isValid() && vi->rect().intersects(area) && vi->visited != visited) {
            QModelIndex index  = _this->dd->listViewItemToIndex(*vi);
            Q_ASSERT(index.isValid());
            _this->interSectingVector->append(index);
            vi->visited = visited;
        }
    }
}